

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_encodeSequences
                 (void *dst,size_t dstCapacity,FSE_CTable *CTable_MatchLength,BYTE *mlCodeTable,
                 FSE_CTable *CTable_OffsetBits,BYTE *ofCodeTable,FSE_CTable *CTable_LitLength,
                 BYTE *llCodeTable,seqDef *sequences,size_t nbSeq,int longOffsets,int bmi2)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong *puVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong *puVar16;
  uint uVar17;
  size_t sVar18;
  uint uVar19;
  ulong uVar20;
  ulong *puVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  ulong *puVar26;
  uint uVar27;
  ulong uVar28;
  ulong local_b8;
  ulong local_b0;
  
  if (bmi2 == 0) {
    sVar7 = 0xffffffffffffffba;
    if (8 < dstCapacity) {
      uVar2 = (ushort)*CTable_MatchLength;
      uVar23 = (ulong)mlCodeTable[nbSeq - 1];
      lVar13 = (long)(1 << ((char)uVar2 - 1U & 0x1f));
      if (uVar2 == 0) {
        lVar13 = 1;
      }
      uVar25 = CTable_MatchLength[lVar13 + uVar23 * 2 + 2] + 0x8000;
      uVar3 = (ushort)*CTable_OffsetBits;
      bVar1 = ofCodeTable[nbSeq - 1];
      uVar9 = (ulong)bVar1;
      lVar14 = (long)(1 << ((char)uVar3 - 1U & 0x1f));
      if (uVar3 == 0) {
        lVar14 = 1;
      }
      uVar19 = CTable_OffsetBits[lVar14 + uVar9 * 2 + 2] + 0x8000;
      uVar4 = *(ushort *)
               ((long)CTable_MatchLength +
               (long)(int)CTable_MatchLength[lVar13 + uVar23 * 2 + 1] * 2 +
               (ulong)((uVar25 & 0xffff0000) - CTable_MatchLength[lVar13 + uVar23 * 2 + 2] >>
                      ((byte)(uVar25 >> 0x10) & 0x3f)) * 2 + 4);
      local_b0 = (ulong)*(ushort *)
                         ((long)CTable_OffsetBits +
                         (long)(int)CTable_OffsetBits[lVar14 + uVar9 * 2 + 1] * 2 +
                         (ulong)((uVar19 & 0xffff0000) - CTable_OffsetBits[lVar14 + uVar9 * 2 + 2]
                                >> ((byte)(uVar19 >> 0x10) & 0x3f)) * 2 + 4);
      uVar5 = (ushort)*CTable_LitLength;
      lVar15 = (long)(1 << ((char)uVar5 - 1U & 0x1f));
      if (uVar5 == 0) {
        lVar15 = 1;
      }
      uVar8 = (ulong)llCodeTable[nbSeq - 1];
      uVar25 = CTable_LitLength[lVar15 + uVar8 * 2 + 2] + 0x8000;
      local_b8 = (ulong)*(ushort *)
                         ((long)CTable_LitLength +
                         (long)(int)CTable_LitLength[lVar15 + uVar8 * 2 + 1] * 2 +
                         (ulong)((uVar25 & 0xffff0000) - CTable_LitLength[lVar15 + uVar8 * 2 + 2] >>
                                ((byte)(uVar25 >> 0x10) & 0x3f)) * 2 + 4);
      uVar25 = LL_bits[uVar8];
      uVar8 = (ulong)((uint)sequences[nbSeq - 1].matchLength & BIT_mask[ML_bits[uVar23]]) <<
              ((byte)uVar25 & 0x3f) |
              (ulong)((uint)sequences[nbSeq - 1].litLength & BIT_mask[uVar25]);
      uVar25 = ML_bits[uVar23] + uVar25;
      puVar16 = (ulong *)((long)dst + (dstCapacity - 8));
      puVar11 = (ulong *)dst;
      if (longOffsets == 0) {
        uVar8 = (ulong)(BIT_mask[uVar9] & sequences[nbSeq - 1].offset) << ((byte)uVar25 & 0x3f) |
                uVar8;
        uVar25 = uVar25 + bVar1;
      }
      else {
        uVar19 = 0x38;
        if (bVar1 < 0x38) {
          uVar19 = (uint)bVar1;
        }
        uVar17 = bVar1 - uVar19;
        if (0x38 < bVar1) {
          uVar8 = (ulong)(BIT_mask[uVar17] & sequences[nbSeq - 1].offset) << ((byte)uVar25 & 0x3f) |
                  uVar8;
          uVar25 = uVar25 + uVar17;
          puVar11 = (ulong *)((ulong)(uVar25 >> 3) + (long)dst);
          if (puVar16 < puVar11) {
            puVar11 = puVar16;
          }
          *(ulong *)dst = uVar8;
          uVar8 = uVar8 >> ((byte)uVar25 & 0x38);
          uVar25 = uVar25 & 7;
        }
        uVar8 = (ulong)(sequences[nbSeq - 1].offset >> ((byte)uVar17 & 0x1f) & BIT_mask[uVar19]) <<
                ((byte)uVar25 & 0x3f) | uVar8;
        uVar25 = uVar25 + uVar19;
      }
      puVar26 = (ulong *)((ulong)(uVar25 >> 3) + (long)puVar11);
      if (puVar16 < puVar26) {
        puVar26 = puVar16;
      }
      *puVar11 = uVar8;
      uVar8 = uVar8 >> ((byte)uVar25 & 0x38);
      uVar25 = uVar25 & 7;
      if (1 < nbSeq) {
        uVar23 = nbSeq - 2;
        do {
          uVar28 = (ulong)llCodeTable[uVar23];
          bVar1 = ofCodeTable[uVar23];
          uVar24 = (ulong)bVar1;
          uVar22 = (ulong)mlCodeTable[uVar23];
          uVar9 = CTable_OffsetBits[lVar14 + uVar24 * 2 + 2] + local_b0;
          uVar19 = (uint)local_b0;
          iVar6 = (int)(uVar9 >> 0x10) + uVar25;
          local_b0 = (ulong)*(ushort *)
                             ((long)CTable_OffsetBits +
                             (long)(int)CTable_OffsetBits[lVar14 + uVar24 * 2 + 1] * 2 +
                             (local_b0 >> ((byte)(uVar9 >> 0x10) & 0x3f)) * 2 + 4);
          uVar20 = (ulong)CTable_MatchLength[lVar13 + uVar22 * 2 + 2] + (ulong)uVar4;
          uVar17 = (uint)uVar4;
          iVar12 = (int)(uVar20 >> 0x10) + iVar6;
          uVar10 = CTable_LitLength[lVar15 + uVar28 * 2 + 2] + local_b8;
          uVar4 = *(ushort *)
                   ((long)CTable_MatchLength +
                   (long)(int)CTable_MatchLength[lVar13 + uVar22 * 2 + 1] * 2 +
                   (ulong)(uVar4 >> ((byte)(uVar20 >> 0x10) & 0x3f)) * 2 + 4);
          uVar8 = (ulong)(BIT_mask[uVar10 >> 0x10] & (uint)local_b8) << ((byte)iVar12 & 0x3f) |
                  (ulong)(BIT_mask[uVar20 >> 0x10] & uVar17) << ((byte)iVar6 & 0x3f) |
                  (ulong)(BIT_mask[uVar9 >> 0x10] & uVar19) << (sbyte)uVar25 | uVar8;
          uVar19 = LL_bits[uVar28];
          uVar25 = ML_bits[uVar22];
          uVar17 = (int)(uVar10 >> 0x10) + iVar12;
          local_b8 = (ulong)*(ushort *)
                             ((long)CTable_LitLength +
                             (long)(int)CTable_LitLength[lVar15 + uVar28 * 2 + 1] * 2 +
                             (local_b8 >> ((byte)(uVar10 >> 0x10) & 0x3f)) * 2 + 4);
          uVar27 = uVar25 + uVar19 + bVar1;
          puVar11 = puVar26;
          if (0x1e < uVar27) {
            puVar11 = (ulong *)((ulong)(uVar17 >> 3) + (long)puVar26);
            if (puVar16 < puVar11) {
              puVar11 = puVar16;
            }
            *puVar26 = uVar8;
            uVar8 = uVar8 >> ((byte)uVar17 & 0x38);
            uVar17 = uVar17 & 7;
          }
          uVar8 = (ulong)((uint)sequences[uVar23].matchLength & BIT_mask[uVar25]) <<
                  ((byte)(uVar19 + uVar17) & 0x3f) |
                  (ulong)((uint)sequences[uVar23].litLength & BIT_mask[uVar19]) <<
                  ((byte)uVar17 & 0x3f) | uVar8;
          uVar25 = uVar25 + uVar19 + uVar17;
          puVar21 = puVar11;
          if (0x38 < uVar27) {
            puVar21 = (ulong *)((ulong)(uVar25 >> 3) + (long)puVar11);
            if (puVar16 < puVar21) {
              puVar21 = puVar16;
            }
            *puVar11 = uVar8;
            uVar8 = uVar8 >> ((byte)uVar25 & 0x38);
            uVar25 = uVar25 & 7;
          }
          if (longOffsets == 0) {
            uVar8 = (ulong)(BIT_mask[uVar24] & sequences[uVar23].offset) << ((byte)uVar25 & 0x3f) |
                    uVar8;
            uVar25 = uVar25 + bVar1;
          }
          else {
            uVar19 = (uint)bVar1;
            if (0x37 < bVar1) {
              uVar19 = 0x38;
            }
            uVar17 = bVar1 - uVar19;
            puVar11 = puVar21;
            if (0x38 < bVar1) {
              uVar8 = (ulong)(BIT_mask[uVar17] & sequences[uVar23].offset) << ((byte)uVar25 & 0x3f)
                      | uVar8;
              uVar25 = uVar25 + uVar17;
              puVar11 = (ulong *)((ulong)(uVar25 >> 3) + (long)puVar21);
              if (puVar16 < puVar11) {
                puVar11 = puVar16;
              }
              *puVar21 = uVar8;
              uVar8 = uVar8 >> ((byte)uVar25 & 0x38);
              uVar25 = uVar25 & 7;
            }
            uVar8 = (ulong)(sequences[uVar23].offset >> ((byte)uVar17 & 0x1f) & BIT_mask[uVar19]) <<
                    ((byte)uVar25 & 0x3f) | uVar8;
            uVar25 = uVar25 + uVar19;
            puVar21 = puVar11;
          }
          puVar26 = (ulong *)((ulong)(uVar25 >> 3) + (long)puVar21);
          if (puVar16 < puVar26) {
            puVar26 = puVar16;
          }
          *puVar21 = uVar8;
          uVar8 = uVar8 >> ((byte)uVar25 & 0x38);
          uVar23 = uVar23 - 1;
          uVar25 = uVar25 & 7;
        } while (uVar23 < nbSeq);
      }
      uVar8 = (ulong)((uint)uVar4 & BIT_mask[uVar2]) << (sbyte)uVar25 | uVar8;
      uVar25 = uVar25 + uVar2;
      puVar11 = (ulong *)((ulong)(uVar25 >> 3) + (long)puVar26);
      if (puVar16 < puVar11) {
        puVar11 = puVar16;
      }
      *puVar26 = uVar8;
      uVar23 = (ulong)((uint)local_b0 & BIT_mask[uVar3]) << (sbyte)(uVar25 & 7) |
               uVar8 >> ((byte)uVar25 & 0x38);
      uVar25 = (uVar25 & 7) + (uint)uVar3;
      puVar26 = (ulong *)((ulong)(uVar25 >> 3) + (long)puVar11);
      if (puVar16 < puVar26) {
        puVar26 = puVar16;
      }
      *puVar11 = uVar23;
      uVar23 = (ulong)((uint)local_b8 & BIT_mask[uVar5]) << (sbyte)(uVar25 & 7) |
               uVar23 >> ((byte)uVar25 & 0x38);
      uVar25 = (uVar25 & 7) + (uint)uVar5;
      *puVar26 = uVar23;
      puVar26 = (ulong *)((ulong)(uVar25 >> 3) + (long)puVar26);
      if (puVar16 < puVar26) {
        puVar26 = puVar16;
      }
      uVar19 = (uVar25 & 7) + 1;
      puVar11 = (ulong *)((ulong)(uVar19 >> 3) + (long)puVar26);
      if (puVar16 < puVar11) {
        puVar11 = puVar16;
      }
      *puVar26 = uVar23 >> ((byte)uVar25 & 0x38) | 1L << (uVar25 & 7);
      sVar18 = 0;
      if (puVar11 < puVar16) {
        sVar18 = (long)puVar11 - ((long)dst + ((ulong)((uVar19 & 7) == 0) - 1));
      }
      sVar7 = 0xffffffffffffffba;
      if (sVar18 != 0) {
        sVar7 = sVar18;
      }
    }
    return sVar7;
  }
  sVar7 = ZSTD_encodeSequences_bmi2
                    (dst,dstCapacity,CTable_MatchLength,mlCodeTable,CTable_OffsetBits,ofCodeTable,
                     CTable_LitLength,llCodeTable,sequences,nbSeq,longOffsets);
  return sVar7;
}

Assistant:

size_t ZSTD_encodeSequences(
            void* dst, size_t dstCapacity,
            FSE_CTable const* CTable_MatchLength, BYTE const* mlCodeTable,
            FSE_CTable const* CTable_OffsetBits, BYTE const* ofCodeTable,
            FSE_CTable const* CTable_LitLength, BYTE const* llCodeTable,
            seqDef const* sequences, size_t nbSeq, int longOffsets, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return ZSTD_encodeSequences_bmi2(dst, dstCapacity,
                                         CTable_MatchLength, mlCodeTable,
                                         CTable_OffsetBits, ofCodeTable,
                                         CTable_LitLength, llCodeTable,
                                         sequences, nbSeq, longOffsets);
    }
#endif
    (void)bmi2;
    return ZSTD_encodeSequences_default(dst, dstCapacity,
                                        CTable_MatchLength, mlCodeTable,
                                        CTable_OffsetBits, ofCodeTable,
                                        CTable_LitLength, llCodeTable,
                                        sequences, nbSeq, longOffsets);
}